

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase1629::TestCase1629(TestCase1629 *this)

{
  TestCase1629 *this_local;
  
  kj::TestCase::TestCase
            (&this->super_TestCase,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
             ,0x65d,"legacy test: Orphans/ConcatenatePointerLists");
  (this->super_TestCase)._vptr_TestCase = (_func_int **)&PTR_run_005c22f0;
  return;
}

Assistant:

TEST(Orphans, ConcatenatePointerLists) {
  MallocMessageBuilder message;
  auto orphanage = message.getOrphanage();

  auto list1 = orphanage.newOrphan<List<Text>>(3);
  initList(list1.get(), {"foo", "bar", "baz"});

  auto list2 = orphanage.newOrphan<List<Text>>(2);
  initList(list2.get(), {"qux", "corge"});

  auto list3 = orphanage.newOrphan<List<Text>>(4);
  initList(list3.get(), {"grault", "garply", "waldo", "fred"});

  List<Text>::Reader lists[] = { list1.getReader(), list2.getReader(), list3.getReader() };
  kj::ArrayPtr<List<Text>::Reader> array = lists;

  auto cat = message.getOrphanage().newOrphanConcat(array);

  checkList(cat.getReader(), {
      "foo", "bar", "baz", "qux", "corge", "grault", "garply", "waldo", "fred"});
}